

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::writeTarget
          (PromiseClient *this,Builder target)

{
  long in_RSI;
  Maybe<kj::Own<capnp::ClientHook>_> MVar1;
  
  *(undefined1 *)(in_RSI + 0x68) = 1;
  MVar1 = RpcConnectionState::writeTarget
                    ((RpcConnectionState *)this,*(ClientHook **)(in_RSI + 0x20),target);
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      receivedCall = true;
      return connectionState->writeTarget(*cap, target);
    }